

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeInt64Constant(Builder *this,Id typeId,unsigned_long_long value,bool specConstant)

{
  Id IVar1;
  Instruction *this_00;
  undefined4 in_register_00000034;
  size_t size;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_60 [3];
  Instruction *local_48;
  Instruction *c;
  uint local_38;
  Id existing;
  uint op2;
  uint op1;
  Op opcode;
  bool specConstant_local;
  unsigned_long_long value_local;
  Builder *pBStack_18;
  Id typeId_local;
  Builder *this_local;
  
  size = CONCAT44(in_register_00000034,typeId);
  op2 = OpConstant;
  if (specConstant) {
    op2 = OpSpecConstant;
  }
  existing = (Id)value;
  local_38 = (uint)(value >> 0x20);
  op1._3_1_ = specConstant;
  _opcode = value;
  value_local._4_4_ = typeId;
  pBStack_18 = this;
  if (!specConstant) {
    size = 0x15;
    IVar1 = findScalarConstant(this,OpTypeInt,op2,typeId,existing,local_38);
    value = CONCAT44(local_38,existing);
    if (IVar1 != 0) {
      return IVar1;
    }
    c._4_4_ = 0;
  }
  local_38 = (uint)(value >> 0x20);
  existing = (Id)value;
  this_00 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size);
  IVar1 = getUniqueId(this);
  Instruction::Instruction(this_00,IVar1,value_local._4_4_,op2);
  local_48 = this_00;
  Instruction::addImmediateOperand(this_00,existing);
  Instruction::addImmediateOperand(local_48,local_38);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_60,local_48
            );
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,(value_type *)local_60);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_60);
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
            (this->groupedConstants + 0x15,&local_48);
  Module::mapInstruction(&this->module,local_48);
  IVar1 = Instruction::getResultId(local_48);
  return IVar1;
}

Assistant:

Id Builder::makeInt64Constant(Id typeId, unsigned long long value, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstant : OpConstant;

    unsigned op1 = value & 0xFFFFFFFF;
    unsigned op2 = value >> 32;

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = findScalarConstant(OpTypeInt, opcode, typeId, op1, op2);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->addImmediateOperand(op1);
    c->addImmediateOperand(op2);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeInt].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}